

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void Logger::log_analysis_stage(string *message,bool newline)

{
  ostream *poVar1;
  long lVar2;
  stringstream local_1d0 [8];
  stringstream ss;
  undefined1 local_1c0 [376];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,anon_var_dwarf_321f5b,0x15);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c0,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
  lVar2 = message->_M_string_length - 0x51;
  while (lVar2 = lVar2 + 1, lVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,anon_var_dwarf_321f87,3)
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&instance,(char *)local_48,local_40)
  ;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&instance,"\x1b[0m",4);
  if (newline) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&instance,"\n",1);
  }
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  return;
}

Assistant:

void Logger::log_analysis_stage(const std::string &message, bool newline) {
  std::stringstream ss;
  ss << FC_CYAN_BRIGHT "████  " << message << "  ";
  // this makes sure that all log analysis stage messages have the same length
  auto remaining_chars = 80-message.length();
  while (remaining_chars--) ss << "█";
  instance.logfile << ss.str();
  instance.logfile << F_RESET;
  if (newline) instance.logfile << "\n";
}